

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemdelegate.cpp
# Opt level: O2

void QAbstractItemDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  EndEditHint _t2;
  QWidget *_t1;
  
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
    case 1:
    case 2:
    case 4:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        return;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
  }
  else if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QAbstractItemDelegate::*)(QWidget*)>
                      ((QtMocHelpers *)_a,(void **)commitData,0,0);
    if ((!bVar1) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QAbstractItemDelegate::*)(QWidget*,QAbstractItemDelegate::EndEditHint)>
                          ((QtMocHelpers *)_a,(void **)closeEditor,0,1), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QAbstractItemDelegate::*)(QModelIndex_const&)>
                ((QtMocHelpers *)_a,(void **)sizeHintChanged,0,3);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      commitData((QAbstractItemDelegate *)_o,*_a[1]);
      return;
    case 1:
      _t1 = *_a[1];
      _t2 = *_a[2];
      break;
    case 2:
      _t1 = *_a[1];
      _t2 = NoHint;
      break;
    case 3:
      sizeHintChanged((QAbstractItemDelegate *)_o,(QModelIndex *)_a[1]);
      return;
    case 4:
      QAbstractItemDelegatePrivate::_q_commitDataAndCloseEditor
                (*(QAbstractItemDelegatePrivate **)(_o + 8),*_a[1]);
      return;
    default:
      goto switchD_004df195_default;
    }
    closeEditor((QAbstractItemDelegate *)_o,_t1,_t2);
    return;
  }
switchD_004df195_default:
  return;
}

Assistant:

void QAbstractItemDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 1: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 2: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->sizeHintChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->d_func()->_q_commitDataAndCloseEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * )>(_a, &QAbstractItemDelegate::commitData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * , QAbstractItemDelegate::EndEditHint )>(_a, &QAbstractItemDelegate::closeEditor, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(const QModelIndex & )>(_a, &QAbstractItemDelegate::sizeHintChanged, 3))
            return;
    }
}